

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::WriteTextCommandWithDirectGlyphSelection
          (AbstractContentContext *this,GlyphUnicodeMappingList *inText,ITextCommand *inTextCommand)

{
  double dVar1;
  bool bVar2;
  EStatusCode EVar3;
  int iVar4;
  PDFUsedFont *this_00;
  Trace *pTVar5;
  undefined4 extraout_var;
  GraphicState *pGVar6;
  reference puVar7;
  string local_100;
  _Self local_e0;
  string local_d8;
  _Self local_b8;
  _Self local_b0;
  iterator it;
  undefined1 local_a0 [3];
  char formattingBuffer [5];
  OutputStringBufferStream stringStream;
  string fontName;
  bool local_51;
  undefined1 local_50 [7];
  bool writeAsCID;
  UShortList encodedCharactersList;
  ObjectIDType fontObjectID;
  PDFUsedFont *currentFont;
  ITextCommand *inTextCommand_local;
  GlyphUnicodeMappingList *inText_local;
  AbstractContentContext *this_local;
  
  this_00 = GetCurrentFont(this);
  if (this_00 == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined"
                     );
    return eFailure;
  }
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::list
            ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  EVar3 = PDFUsedFont::EncodeStringForShowing
                    (this_00,inText,
                     &encodedCharactersList.
                      super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      _M_node._M_size,
                     (list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,&local_51);
  if (EVar3 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters"
                     );
    this_local._4_4_ = eFailure;
    goto LAB_001c5361;
  }
  bVar2 = std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  if ((bVar2) ||
     (encodedCharactersList.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl._M_node._M_size == 0)) {
    this_local._4_4_ = eSuccess;
    goto LAB_001c5361;
  }
  iVar4 = (*this->_vptr_AbstractContentContext[2])();
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            ((string *)&stringStream.mOwnsBuffer,(ResourcesDictionary *)CONCAT44(extraout_var,iVar4)
             ,encodedCharactersList.
              super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
              _M_size);
  pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  bVar2 = std::operator!=(&pGVar6->mPlacedFontName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stringStream.mOwnsBuffer);
  if (bVar2) {
LAB_001c50d4:
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    TfLow(this,(string *)&stringStream.mOwnsBuffer,pGVar6->mFontSize);
  }
  else {
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    dVar1 = pGVar6->mPlacedFontSize;
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    if ((dVar1 != pGVar6->mFontSize) || (NAN(dVar1) || NAN(pGVar6->mFontSize))) goto LAB_001c50d4;
  }
  OutputStringBufferStream::OutputStringBufferStream((OutputStringBufferStream *)local_a0);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  if ((local_51 & 1U) == 0) {
    while( true ) {
      local_e0._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                     ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
      bVar2 = std::operator!=(&local_b0,&local_e0);
      if (!bVar2) break;
      puVar7 = std::_List_iterator<unsigned_short>::operator*(&local_b0);
      it._M_node._3_1_ = (undefined1)*puVar7;
      OutputStringBufferStream::Write
                ((OutputStringBufferStream *)local_a0,(Byte *)((long)&it._M_node + 3),1);
      std::_List_iterator<unsigned_short>::operator++(&local_b0);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_100,(OutputStringBufferStream *)local_a0);
    (*inTextCommand->_vptr_ITextCommand[1])(inTextCommand,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    while( true ) {
      local_b8._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                     ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
      bVar2 = std::operator!=(&local_b0,&local_b8);
      if (!bVar2) break;
      puVar7 = std::_List_iterator<unsigned_short>::operator*(&local_b0);
      it._M_node._3_1_ = *(undefined1 *)((long)puVar7 + 1);
      OutputStringBufferStream::Write
                ((OutputStringBufferStream *)local_a0,(Byte *)((long)&it._M_node + 3),1);
      puVar7 = std::_List_iterator<unsigned_short>::operator*(&local_b0);
      it._M_node._3_1_ = (undefined1)*puVar7;
      OutputStringBufferStream::Write
                ((OutputStringBufferStream *)local_a0,(Byte *)((long)&it._M_node + 3),1);
      std::_List_iterator<unsigned_short>::operator++(&local_b0);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_d8,(OutputStringBufferStream *)local_a0);
    (**inTextCommand->_vptr_ITextCommand)(inTextCommand,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  this_local._4_4_ = eSuccess;
  OutputStringBufferStream::~OutputStringBufferStream((OutputStringBufferStream *)local_a0);
  std::__cxx11::string::~string((string *)&stringStream.mOwnsBuffer);
LAB_001c5361:
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::~list
            ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  return this_local._4_4_;
}

Assistant:

EStatusCode AbstractContentContext::WriteTextCommandWithDirectGlyphSelection(const GlyphUnicodeMappingList& inText,ITextCommand* inTextCommand)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined");
		return PDFHummus::eFailure;
	}

	ObjectIDType fontObjectID;
	UShortList encodedCharactersList;
	bool writeAsCID;	

	if(currentFont->EncodeStringForShowing(inText,fontObjectID,encodedCharactersList,writeAsCID) != PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharactersList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	UShortList::iterator it = encodedCharactersList.begin();
	if(writeAsCID)
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = ((*it) >> 8) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
		}
		inTextCommand->WriteHexStringCommand(stringStream.ToString());
	}
	else
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer,1);
		}
		inTextCommand->WriteLiteralStringCommand(stringStream.ToString());	
	}
	return PDFHummus::eSuccess;
}